

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

void acutest_finish_test_line_(int result)

{
  int color_00;
  char *pcVar1;
  char *str_1;
  int color;
  char *str;
  int result_local;
  
  if (acutest_tap_ == 0) {
    color_00 = 5;
    if (result == 0) {
      color_00 = 4;
    }
    pcVar1 = "FAILED";
    if (result == 0) {
      pcVar1 = "OK";
    }
    printf("[ ");
    acutest_colored_printf_(color_00,"%s",pcVar1);
    printf(" ]");
    if ((result == 0) && (acutest_timer_ != 0)) {
      printf("  ");
      acutest_timer_print_diff_();
    }
    printf("\n");
  }
  else {
    pcVar1 = "not ok";
    if (result == 0) {
      pcVar1 = "ok";
    }
    printf("%s %d - %s\n",pcVar1,(ulong)(acutest_current_index_ + 1),acutest_current_test_->name);
    if ((result == 0) && (acutest_timer_ != 0)) {
      printf("# Duration: ");
      acutest_timer_print_diff_();
      printf("\n");
    }
  }
  return;
}

Assistant:

static void
acutest_finish_test_line_(int result)
{
    if(acutest_tap_) {
        const char* str = (result == 0) ? "ok" : "not ok";

        printf("%s %d - %s\n", str, acutest_current_index_ + 1, acutest_current_test_->name);

        if(result == 0  &&  acutest_timer_) {
            printf("# Duration: ");
            acutest_timer_print_diff_();
            printf("\n");
        }
    } else {
        int color = (result == 0) ? ACUTEST_COLOR_GREEN_INTENSIVE_ : ACUTEST_COLOR_RED_INTENSIVE_;
        const char* str = (result == 0) ? "OK" : "FAILED";
        printf("[ ");
        acutest_colored_printf_(color, "%s", str);
        printf(" ]");

        if(result == 0  &&  acutest_timer_) {
            printf("  ");
            acutest_timer_print_diff_();
        }

        printf("\n");
    }
}